

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

void __thiscall cmBoundsCheckerParser::ParseError(cmBoundsCheckerParser *this,char **atts)

{
  cmCTest *pcVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  string local_378 [32];
  ostringstream local_358 [8];
  ostringstream cmCTestLog_msg_1;
  value_type_conflict1 local_1dc;
  string local_1d8 [48];
  ostringstream local_1a8 [8];
  ostringstream cmCTestLog_msg;
  value_type_conflict1 local_2c;
  char *local_28;
  char *cat;
  CatToErrorType *ptr;
  char **atts_local;
  cmBoundsCheckerParser *this_local;
  
  cat = (char *)cmCTestMemCheckBoundsChecker;
  ptr = (CatToErrorType *)atts;
  atts_local = (char **)this;
  local_28 = GetAttribute(this,"ErrorCategory",atts);
  if (local_28 == (char *)0x0) {
    local_2c = 1;
    std::vector<int,_std::allocator<int>_>::push_back(&this->Errors,&local_2c);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,"No Category found in Bounds checker XML\n");
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x5f,pcVar3,false);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  else {
    for (; *(long *)cat != 0 && local_28 != (char *)0x0; cat = cat + 0x10) {
      iVar2 = strcmp(*(char **)cat,local_28);
      if (iVar2 == 0) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&this->Errors,(value_type_conflict1 *)(cat + 8));
        return;
      }
    }
    if (*(long *)cat != 0) {
      local_1dc = 1;
      std::vector<int,_std::allocator<int>_>::push_back(&this->Errors,&local_1dc);
      std::__cxx11::ostringstream::ostringstream(local_358);
      poVar4 = std::operator<<((ostream *)local_358,"Found unknown Bounds Checker error ");
      poVar4 = std::operator<<(poVar4,*(char **)cat);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x6d,pcVar3,false);
      std::__cxx11::string::~string(local_378);
      std::__cxx11::ostringstream::~ostringstream(local_358);
    }
  }
  return;
}

Assistant:

void ParseError(const char** atts)
  {
    CatToErrorType* ptr = cmCTestMemCheckBoundsChecker;
    const char* cat = this->GetAttribute("ErrorCategory", atts);
    if (!cat) {
      this->Errors.push_back(cmCTestMemCheckHandler::ABW); // do not know
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "No Category found in Bounds checker XML\n");
      return;
    }
    while (ptr->ErrorCategory && cat) {
      if (strcmp(ptr->ErrorCategory, cat) == 0) {
        this->Errors.push_back(ptr->ErrorCode);
        return; // found it we are done
      }
      ptr++;
    }
    if (ptr->ErrorCategory) {
      this->Errors.push_back(cmCTestMemCheckHandler::ABW); // do not know
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Found unknown Bounds Checker error " << ptr->ErrorCategory
                                                       << std::endl);
    }
  }